

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FigureTests-v4.cpp
# Opt level: O3

void __thiscall
v4::FigureTests_v4_cloned_square_via_base_pointer_should_return_same_area_Test::TestBody
          (FigureTests_v4_cloned_square_via_base_pointer_should_return_same_area_Test *this)

{
  bool bVar1;
  long *plVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  char local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR__Figure_00165d90;
  plVar2[1] = 0x4010000000000000;
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4030000000000000;
  local_28.data_ = (AssertHelperData *)&DAT_4030000000000000;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<double>>::operator()
            (local_20,(char *)&local_30,(double *)"square.area()");
  if (local_20[0] == '\0') {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/FigureTests-v4.cpp"
               ,0x57,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_30.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_4030000000000000;
    local_28.data_ = (AssertHelperData *)(**(code **)(*plVar2 + 0x10))(plVar2);
    testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<double>>::
    operator()(local_20,(char *)&local_30,(double *)"figure->area()");
    if (local_20[0] == '\0') {
      testing::Message::Message((Message *)&local_30);
      if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/FigureTests-v4.cpp"
                 ,0x58,pcVar3);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_30.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_30.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  (**(code **)(*plVar2 + 8))(plVar2);
  return;
}

Assistant:

Square* clone() const override     // return type is Square* instead of Figure* (Covariant Return Type)
    {
        return new Square(*this);
    }